

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

string * __thiscall
QPDFObjectHandle::getUTF8Value_abi_cxx11_(string *__return_storage_ptr__,QPDFObjectHandle *this)

{
  allocator<char> local_55 [20];
  allocator<char> local_41;
  string local_40;
  QPDF_String *local_20;
  QPDF_String *str;
  QPDFObjectHandle *this_local;
  
  str = (QPDF_String *)this;
  this_local = (QPDFObjectHandle *)__return_storage_ptr__;
  local_20 = ::qpdf::BaseHandle::as<QPDF_String>(&this->super_BaseHandle);
  if (local_20 == (QPDF_String *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"returning empty string",&local_41);
    typeWarning(this,"string",&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    QTC::TC("qpdf","QPDFObjectHandle string returning empty utf8",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",local_55)
    ;
    std::allocator<char>::~allocator(local_55);
  }
  else {
    QPDF_String::getUTF8Val_abi_cxx11_(__return_storage_ptr__,local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFObjectHandle::getUTF8Value() const
{
    if (auto str = as<QPDF_String>()) {
        return str->getUTF8Val();
    } else {
        typeWarning("string", "returning empty string");
        QTC::TC("qpdf", "QPDFObjectHandle string returning empty utf8");
        return "";
    }
}